

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ManIncrementTravId(Nwk_Man_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  
  iVar2 = pNtk->nTravIds;
  if (0x3fffffe < iVar2) {
    pNtk->nTravIds = 0;
    for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(pNtk->vObjs,iVar2);
      if (pvVar1 != (void *)0x0) {
        *(undefined4 *)((long)pvVar1 + 0x28) = 0;
      }
    }
    iVar2 = pNtk->nTravIds;
  }
  pNtk->nTravIds = iVar2 + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the current traversal ID of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Nwk_ManIncrementTravId( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int i;
    if ( pNtk->nTravIds >= (1<<26)-1 )
    {
        pNtk->nTravIds = 0;
        Nwk_ManForEachObj( pNtk, pObj, i )
            pObj->TravId = 0;
    }
    pNtk->nTravIds++;
}